

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

int cmsys::anon_unknown_3::GetFieldsFromFile<long_long>
              (char *fileName,char **fieldNames,longlong *values)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  allocator<char> local_4b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  allocator<char> local_478 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  char buf [1024];
  
  fields.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __stream = fopen(fileName,"r");
  iVar12 = -1;
  if (__stream != (FILE *)0x0) {
    iVar8 = 0;
    memset(buf,0,0x400);
LAB_0033650e:
    while ((iVar1 = feof(__stream), iVar1 == 0 && (iVar1 = ferror(__stream), iVar1 == 0))) {
      piVar2 = __errno_location();
      *piVar2 = 0;
      pcVar3 = fgets(buf,0x400,__stream);
      pcVar4 = buf;
      if (pcVar3 != (char *)0x0) {
        do {
          if (*pcVar4 == '\n') {
            *pcVar4 = '\0';
          }
          else if (*pcVar4 == '\0') goto LAB_00336583;
          pcVar4 = pcVar4 + 1;
        } while( true );
      }
      iVar1 = ferror(__stream);
      if ((iVar1 != 0) && (*piVar2 == 4)) {
        clearerr(__stream);
      }
    }
    iVar1 = ferror(__stream);
    fclose(__stream);
    if (iVar8 == 0 || iVar1 != 0) goto LAB_003366c4;
    lVar11 = 0;
    do {
      lVar5 = lVar11;
      if (fieldNames[lVar5] == (char *)0x0) {
        iVar12 = 0;
        goto LAB_003366c4;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_478,fieldNames[lVar5],&local_4b9);
      uVar7 = (long)fields.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)fields.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar11 = 0;
      for (uVar9 = 0; uVar10 = uVar7, uVar7 != uVar9; uVar9 = uVar9 + 1) {
        lVar6 = std::__cxx11::string::find
                          ((string *)
                           ((long)&((fields.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar11),(ulong)local_478);
        if (lVar6 != -1) {
          std::__cxx11::string::substr
                    ((ulong)&local_458,
                     (long)&((fields.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar11
                    );
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)buf,(string *)&local_458,_S_in);
          std::__cxx11::string::~string((string *)&local_458);
          std::istream::_M_extract<long_long>((longlong *)buf);
          std::__cxx11::istringstream::~istringstream((istringstream *)buf);
          uVar10 = uVar9;
          break;
        }
        lVar11 = lVar11 + 0x20;
      }
      std::__cxx11::string::~string((string *)local_478);
      lVar11 = lVar5 + 1;
    } while (uVar10 < uVar7);
    iVar12 = -2 - (int)lVar5;
  }
LAB_003366c4:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&fields);
  return iVar12;
LAB_00336583:
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,buf,local_478);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&fields,&local_458
            );
  std::__cxx11::string::~string((string *)&local_458);
  iVar8 = iVar8 + 1;
  goto LAB_0033650e;
}

Assistant:

int GetFieldsFromFile(const char* fileName, const char** fieldNames, T* values)
{
  std::vector<std::string> fields;
  if (!LoadLines(fileName, fields)) {
    return -1;
  }
  int i = 0;
  while (fieldNames[i] != NULL) {
    int ierr = NameValue(fields, fieldNames[i], values[i]);
    if (ierr) {
      return -(i + 2);
    }
    i += 1;
  }
  return 0;
}